

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void getSWTRecCoeff(double *coeff,int *length,char *ctype,int level,int J,double *lpr,double *hpr,
                   int lf,int siglength,double *swtop)

{
  size_t __size;
  long lVar1;
  int a;
  int iVar2;
  int iVar3;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  double *x;
  double *x_00;
  double *y;
  double *oup;
  double *oup_00;
  double *oup_01;
  double *oup_02;
  void *__ptr_03;
  double *array;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  int len;
  undefined4 in_register_00000084;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  double dVar16;
  undefined4 in_stack_0000001c;
  
  lVar13 = (long)lf;
  lVar1 = CONCAT44(in_stack_0000001c,siglength);
  __size = lVar13 * 8;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  __ptr_01 = malloc(__size);
  __ptr_02 = malloc(__size);
  x = (double *)malloc(__size);
  x_00 = (double *)malloc(__size);
  y = (double *)malloc(__size);
  sVar10 = (long)(lf % 2 + lf + (int)hpr) << 3;
  oup = (double *)malloc(sVar10);
  oup_00 = (double *)malloc(sVar10);
  sVar10 = (long)(lf + (int)hpr * 2) << 3;
  oup_01 = (double *)malloc(sVar10);
  oup_02 = (double *)malloc(sVar10);
  __ptr_03 = malloc(__size);
  array = (double *)malloc(__size);
  uVar6 = level - (int)ctype;
  a = (int)hpr / 2;
  iVar2 = (int)hpr + -1;
  uVar11 = 0;
  if (0 < lf) {
    uVar11 = (ulong)(uint)lf;
  }
  for (uVar7 = uVar6; (int)uVar7 < level; uVar7 = uVar7 + 1) {
    for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined8 *)(lVar1 + uVar4 * 8) = 0;
    }
    iVar3 = strcmp((char *)length,"appx");
    uVar9 = uVar7 ^ uVar6;
    if (iVar3 == 0 && uVar9 == 0) {
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        *(double *)((long)__ptr + uVar4 * 8) = coeff[uVar4];
        *(undefined8 *)((long)__ptr_00 + uVar4 * 8) = 0;
      }
    }
    else {
      iVar3 = strcmp((char *)length,"det");
      if (iVar3 == 0 && uVar9 == 0) {
        for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
          *(double *)((long)__ptr_00 + uVar4 * 8) = coeff[uVar4];
          *(undefined8 *)((long)__ptr + uVar4 * 8) = 0;
        }
      }
      else {
        for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
          *(undefined8 *)((long)__ptr_00 + uVar4 * 8) = 0;
        }
      }
    }
    dVar16 = ldexp(1.0,~uVar7 + level);
    uVar9 = (uint)dVar16;
    uVar4 = 0;
    if (0 < (int)uVar9) {
      uVar4 = (ulong)uVar9;
    }
    for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
      uVar14 = 0;
      for (uVar5 = uVar12; (long)uVar5 < lVar13; uVar5 = uVar5 + (long)(int)uVar9) {
        *(undefined8 *)((long)__ptr_01 + uVar14 * 8) = *(undefined8 *)((long)__ptr + uVar5 * 8);
        *(undefined8 *)((long)__ptr_02 + uVar14 * 8) = *(undefined8 *)((long)__ptr_00 + uVar5 * 8);
        uVar14 = uVar14 + 1;
      }
      iVar3 = 0;
      for (uVar5 = 0; uVar5 < uVar14; uVar5 = uVar5 + 2) {
        *(undefined8 *)((long)x + uVar5 * 4) = *(undefined8 *)((long)__ptr_01 + uVar5 * 8);
        *(undefined8 *)((long)x_00 + uVar5 * 4) = *(undefined8 *)((long)__ptr_02 + uVar5 * 8);
        iVar3 = iVar3 + 1;
      }
      upsamp2(x,iVar3,2,y);
      iVar15 = (int)uVar5;
      per_ext(y,iVar15,a,oup);
      upsamp2(x_00,iVar3,2,y);
      per_ext(y,iVar15,a,oup_00);
      conv_direct(oup,(int)hpr + iVar15,(double *)CONCAT44(in_register_00000084,J),(int)hpr,oup_01);
      conv_direct(oup_00,(int)hpr + iVar15,lpr,(int)hpr,oup_02);
      for (lVar8 = (long)iVar2; lVar8 < iVar15 + iVar2; lVar8 = lVar8 + 1) {
        *(double *)((long)__ptr_03 + lVar8 * 8 + (long)(int)hpr * -8 + 8) =
             oup_01[lVar8] + oup_02[lVar8];
      }
      iVar3 = 0;
      for (uVar5 = 1; uVar5 < uVar14; uVar5 = uVar5 + 2) {
        *(undefined8 *)((long)x + uVar5 * 4 + -4) = *(undefined8 *)((long)__ptr_01 + uVar5 * 8);
        *(undefined8 *)((long)x_00 + uVar5 * 4 + -4) = *(undefined8 *)((long)__ptr_02 + uVar5 * 8);
        iVar3 = iVar3 + 1;
      }
      upsamp2(x,iVar3,2,y);
      iVar15 = (int)uVar5;
      len = iVar15 + -1;
      per_ext(y,len,a,oup);
      upsamp2(x_00,iVar3,2,y);
      per_ext(y,len,a,oup_00);
      iVar3 = iVar15 + (int)hpr + -1;
      conv_direct(oup,iVar3,(double *)CONCAT44(in_register_00000084,J),(int)hpr,oup_01);
      conv_direct(oup_00,iVar3,lpr,(int)hpr,oup_02);
      for (lVar8 = (long)iVar2; lVar8 < iVar2 + iVar15 + -1; lVar8 = lVar8 + 1) {
        array[(lVar8 + 1) - (long)(int)hpr] = oup_01[lVar8] + oup_02[lVar8];
      }
      circshift(array,len,-1);
      lVar8 = 0;
      for (uVar5 = uVar12; (long)uVar5 < lVar13; uVar5 = uVar5 + (long)(int)uVar9) {
        *(double *)(lVar1 + uVar5 * 8) =
             (*(double *)((long)__ptr_03 + lVar8) + *(double *)((long)array + lVar8)) * 0.5;
        lVar8 = lVar8 + 8;
      }
    }
    for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined8 *)((long)__ptr + uVar4 * 8) = *(undefined8 *)(lVar1 + uVar4 * 8);
    }
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(y);
  free(oup);
  free(oup_00);
  free(oup_01);
  free(oup_02);
  free(__ptr_03);
  free(array);
  free(x);
  free(x_00);
  return;
}

Assistant:

static void getSWTRecCoeff(double *coeff, int *length, const char *ctype, int level, int J, double *lpr,
	double *hpr, int lf, int siglength, double *swtop) {
	int N, iter, i, index, value, count, len;
	int index_shift, len0, U, N1, index2;
	double *appx1, *det1, *appx_sig, *det_sig, *cL0, *cH0, *tempx, *oup00L, *oup00H, *oup00, *oup01, *appx2, *det2;

	N = siglength;
	U = 2;

	appx_sig = (double*)malloc(sizeof(double)* N);
	det_sig = (double*)malloc(sizeof(double)* N);
	appx1 = (double*)malloc(sizeof(double)* N);
	det1 = (double*)malloc(sizeof(double)* N);
	appx2 = (double*)malloc(sizeof(double)* N);
	det2 = (double*)malloc(sizeof(double)* N);
	tempx = (double*)malloc(sizeof(double)* N);
	cL0 = (double*)malloc(sizeof(double)* (N + (N % 2) + lf));
	cH0 = (double*)malloc(sizeof(double)* (N + (N % 2) + lf));
	oup00L = (double*)malloc(sizeof(double)* (N + 2 * lf));
	oup00H = (double*)malloc(sizeof(double)* (N + 2 * lf));
	oup00 = (double*)malloc(sizeof(double)* N);
	oup01 = (double*)malloc(sizeof(double)* N);



	for (iter = J-level; iter < J; ++iter) {
		for (i = 0; i < N; ++i) {
			swtop[i] = 0.0;
		}
		if (!strcmp((ctype), "appx") && (iter == (J-level))) {
			for (i = 0; i < N; ++i) {
				appx_sig[i] = coeff[i];
				det_sig[i] = 0.0;
			}
		}
		else if (!strcmp((ctype), "det") && (iter == (J-level))) {
			for (i = 0; i < N; ++i) {
				det_sig[i] = coeff[i];
				appx_sig[i] = 0.0;
			}
		}
		else {
			for (i = 0; i < N; ++i) {
				det_sig[i] = 0.0;
			}
		}

		value = (int)pow(2.0, (double)(J - 1 - iter));

		for (count = 0; count < value; count++) {
			len = 0;
			for (index = count; index < N; index += value) {
				appx1[len] = appx_sig[index];
				det1[len] = det_sig[index];
				len++;
			}


			//SHIFT 0
			len0 = 0;

			for (index_shift = 0; index_shift < len; index_shift += 2) {
				appx2[len0] = appx1[index_shift];
				det2[len0] = det1[index_shift];
				len0++;
			}
			upsamp2(appx2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cL0);

			upsamp2(det2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cH0);

			N1 = 2 * len0 + lf;


			
			conv_direct(cL0, N1, lpr, lf, oup00L);

			
			conv_direct(cH0, N1, hpr, lf, oup00H);

			for (i = lf - 1; i < 2 * len0 + lf - 1; ++i) {
				oup00[i - lf + 1] = oup00L[i] + oup00H[i];
			}

			//SHIFT 1

			len0 = 0;

			for (index_shift = 1; index_shift < len; index_shift += 2) {
				appx2[len0] = appx1[index_shift];
				det2[len0] = det1[index_shift];
				len0++;
			}

			upsamp2(appx2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cL0);

			upsamp2(det2, len0, U, tempx);
			per_ext(tempx, 2 * len0, lf / 2, cH0);

			N1 = 2 * len0 + lf;

			conv_direct(cL0, N1, lpr, lf, oup00L);

			conv_direct(cH0, N1, hpr, lf, oup00H);

			for (i = lf - 1; i < 2 * len0 + lf - 1; ++i) {
				oup01[i - lf + 1] = oup00L[i] + oup00H[i];
			}

			circshift(oup01, 2 * len0, -1);

			index2 = 0;

			for (index = count; index < N; index += value) {
				swtop[index] = (oup00[index2] + oup01[index2]) / 2.0;
				index2++;
			}

		}
		for (i = 0; i < N; ++i) {
			appx_sig[i] = swtop[i];
		}

	}



	free(appx_sig);
	free(det_sig);
	free(appx1);
	free(det1);
	free(tempx);
	free(cL0);
	free(cH0);
	free(oup00L);
	free(oup00H);
	free(oup00);
	free(oup01);
	free(appx2);
	free(det2);
}